

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O3

ngram_model_t * ngram_model_set_select(ngram_model_t *base,char *name)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ngram_model_t *pnVar5;
  
  iVar1 = base[1].refcount;
  if ((long)iVar1 < 1) {
    uVar4 = 0;
LAB_0013215b:
    if ((int)uVar4 == iVar1) {
      pnVar5 = (ngram_model_t *)0x0;
    }
    else {
      *(int *)&base[1].field_0x4 = (int)uVar4;
      pnVar5 = *(ngram_model_t **)(base[1].n_counts + (uVar4 & 0xffffffff) * 2);
    }
  }
  else {
    lVar2 = *(long *)&base[1].n_1g_alloc;
    pnVar5 = (ngram_model_t *)0x0;
    uVar4 = 0;
    do {
      iVar3 = strcmp(*(char **)(lVar2 + uVar4 * 8),name);
      if (iVar3 == 0) goto LAB_0013215b;
      uVar4 = uVar4 + 1;
    } while ((long)iVar1 != uVar4);
  }
  return pnVar5;
}

Assistant:

ngram_model_t *
ngram_model_set_select(ngram_model_t * base, const char *name)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    /* There probably won't be very many submodels. */
    for (i = 0; i < set->n_models; ++i)
        if (0 == strcmp(set->names[i], name))
            break;
    if (i == set->n_models)
        return NULL;
    set->cur = i;
    return set->lms[set->cur];
}